

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute-eval.hh
# Opt level: O3

string * __thiscall
tinyusdz::tydra::TerminalAttributeValue::type_name_abi_cxx11_
          (string *__return_storage_ptr__,TerminalAttributeValue *this)

{
  pointer pcVar1;
  vtable_type *pvVar2;
  
  if (this->_empty == true) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->_type_name)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->_type_name)._M_string_length)
    ;
  }
  else {
    pvVar2 = (this->_value).v_.vtable;
    if (pvVar2 == (vtable_type *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      *(undefined4 *)&__return_storage_ptr__->field_2 = 0x64696f76;
      __return_storage_ptr__->_M_string_length = 4;
      (__return_storage_ptr__->field_2)._M_local_buf[4] = '\0';
    }
    else {
      (*pvVar2->type_name)((string *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string type_name() const {
    if (_empty) {
      return _type_name;
    }

    return _value.type_name();
  }